

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O1

void __thiscall QGestureEvent::~QGestureEvent(QGestureEvent *this)

{
  Data *pDVar1;
  
  *(undefined ***)this = &PTR__QGestureEvent_007f4230;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->m_targetWidgets).d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->m_accepted).d);
  pDVar1 = (this->m_gestures).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_gestures).d.d)->super_QArrayData,8,0x10);
    }
  }
  QEvent::~QEvent(&this->super_QEvent);
  return;
}

Assistant:

QGestureEvent::~QGestureEvent()
{
}